

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

bool __thiscall QGles2Sampler::create(QGles2Sampler *this)

{
  Filter FVar1;
  int iVar2;
  long in_FS_OFFSET;
  QRhiResource *copy;
  bool local_11;
  QGles2Sampler *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = (this->super_QRhiSampler).m_mipmapMode;
  if ((this->super_QRhiSampler).m_minFilter == Nearest) {
    if (FVar1 == None) {
      iVar2 = 0x2600;
    }
    else {
      iVar2 = (uint)(FVar1 != Nearest) * 2 + 0x2700;
    }
  }
  else if (FVar1 == None) {
    iVar2 = 0x2601;
  }
  else {
    iVar2 = (uint)(FVar1 != Nearest) * 2 + 0x2701;
  }
  *(int *)&(this->super_QRhiSampler).field_0x4c = iVar2;
  *(uint *)&this->field_0x50 = (this->super_QRhiSampler).m_magFilter == Nearest ^ 0x2601;
  *(undefined4 *)&this->field_0x54 =
       *(undefined4 *)(&DAT_006b68cc + (long)(int)(this->super_QRhiSampler).m_addressU * 4);
  *(undefined4 *)&this->field_0x58 =
       *(undefined4 *)(&DAT_006b68cc + (long)(int)(this->super_QRhiSampler).m_addressV * 4);
  *(undefined4 *)&this->field_0x5c =
       *(undefined4 *)(&DAT_006b68cc + (long)(int)(this->super_QRhiSampler).m_addressW * 4);
  *(CompareOp *)&this->field_0x60 = (this->super_QRhiSampler).m_compareOp + 0x200;
  this->generation = this->generation + 1;
  local_11 = false;
  local_10 = this;
  QHash<QRhiResource*,bool>::emplace<bool_const&>
            ((QHash<QRhiResource*,bool> *)
             &((this->super_QRhiSampler).super_QRhiResource.m_rhi)->resources,
             (QRhiResource **)&local_10,&local_11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2Sampler::create()
{
    d.glminfilter = toGlMinFilter(m_minFilter, m_mipmapMode);
    d.glmagfilter = toGlMagFilter(m_magFilter);
    d.glwraps = toGlWrapMode(m_addressU);
    d.glwrapt = toGlWrapMode(m_addressV);
    d.glwrapr = toGlWrapMode(m_addressW);
    d.gltexcomparefunc = toGlTextureCompareFunc(m_compareOp);

    generation += 1;
    QRHI_RES_RHI(QRhiGles2);
    rhiD->registerResource(this, false);
    return true;
}